

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upgrade_proto.cpp
# Opt level: O3

bool caffe::UpgradeV0Net(NetParameter *v0_net_param_padding_layers,NetParameter *net_param)

{
  int iVar1;
  string *psVar2;
  bool bVar3;
  Type *v0_layer_connection;
  Type *layer_param;
  Type *value;
  int *piVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  NetParameter v0_net_param;
  NetParameter local_d0;
  
  NetParameter::NetParameter(&local_d0);
  UpgradeV0PaddingLayers(v0_net_param_padding_layers,&local_d0);
  NetParameter::Clear(net_param);
  if (((byte)local_d0._has_bits_.has_bits_[0] & 1) != 0) {
    (net_param->_has_bits_).has_bits_[0] = (net_param->_has_bits_).has_bits_[0] | 1;
    psVar2 = (net_param->name_).ptr_;
    if (psVar2 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
      google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                (&net_param->name_,local_d0.name_.ptr_);
    }
    else {
      std::__cxx11::string::_M_assign((string *)psVar2);
    }
  }
  if (local_d0.layers_.super_RepeatedPtrFieldBase.current_size_ < 1) {
    bVar5 = true;
  }
  else {
    bVar5 = true;
    iVar7 = 0;
    do {
      v0_layer_connection =
           google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<caffe::V1LayerParameter>::TypeHandler>
                     (&local_d0.layers_.super_RepeatedPtrFieldBase,iVar7);
      layer_param = google::protobuf::internal::RepeatedPtrFieldBase::
                    Add<google::protobuf::RepeatedPtrField<caffe::V1LayerParameter>::TypeHandler>
                              (&(net_param->layers_).super_RepeatedPtrFieldBase,(Type *)0x0);
      bVar3 = UpgradeV0LayerParameter(v0_layer_connection,layer_param);
      bVar5 = (bool)(bVar5 & bVar3);
      iVar7 = iVar7 + 1;
    } while (iVar7 < local_d0.layers_.super_RepeatedPtrFieldBase.current_size_);
  }
  if (0 < local_d0.input_.super_RepeatedPtrFieldBase.current_size_) {
    iVar7 = 0;
    do {
      value = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                        (&local_d0.input_.super_RepeatedPtrFieldBase,iVar7);
      NetParameter::add_input(net_param,value);
      iVar7 = iVar7 + 1;
    } while (iVar7 < local_d0.input_.super_RepeatedPtrFieldBase.current_size_);
  }
  if (0 < local_d0.input_dim_.current_size_) {
    iVar7 = 0;
    do {
      piVar4 = google::protobuf::RepeatedField<int>::Get(&local_d0.input_dim_,iVar7);
      iVar1 = *piVar4;
      iVar6 = (net_param->input_dim_).current_size_;
      if (iVar6 == (net_param->input_dim_).total_size_) {
        google::protobuf::RepeatedField<int>::Reserve(&net_param->input_dim_,iVar6 + 1);
        iVar6 = (net_param->input_dim_).current_size_;
      }
      (net_param->input_dim_).current_size_ = iVar6 + 1;
      ((net_param->input_dim_).rep_)->elements[iVar6] = iVar1;
      iVar7 = iVar7 + 1;
    } while (iVar7 < local_d0.input_dim_.current_size_);
  }
  if (((byte)local_d0._has_bits_.has_bits_[0] & 4) != 0) {
    (net_param->_has_bits_).has_bits_[0] = (net_param->_has_bits_).has_bits_[0] | 4;
    net_param->force_backward_ = local_d0.force_backward_;
  }
  NetParameter::~NetParameter(&local_d0);
  return bVar5;
}

Assistant:

bool UpgradeV0Net(const NetParameter& v0_net_param_padding_layers,
                  NetParameter* net_param) {
  // First upgrade padding layers to padded conv layers.
  NetParameter v0_net_param;
  UpgradeV0PaddingLayers(v0_net_param_padding_layers, &v0_net_param);
  // Now upgrade layer parameters.
  bool is_fully_compatible = true;
  net_param->Clear();
  if (v0_net_param.has_name()) {
    net_param->set_name(v0_net_param.name());
  }
  for (int i = 0; i < v0_net_param.layers_size(); ++i) {
    is_fully_compatible &= UpgradeV0LayerParameter(v0_net_param.layers(i),
                                                   net_param->add_layers());
  }
  for (int i = 0; i < v0_net_param.input_size(); ++i) {
    net_param->add_input(v0_net_param.input(i));
  }
  for (int i = 0; i < v0_net_param.input_dim_size(); ++i) {
    net_param->add_input_dim(v0_net_param.input_dim(i));
  }
  if (v0_net_param.has_force_backward()) {
    net_param->set_force_backward(v0_net_param.force_backward());
  }
  return is_fully_compatible;
}